

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::enterInitializingModeAsync(Federate *this)

{
  bool bVar1;
  pointer p_Var2;
  _Result<bool> *p_Var3;
  InvalidFunctionCall *this_00;
  char *pcVar4;
  _State_baseV2 *__tmp;
  string_view message;
  size_t sStack_b0;
  Modes cmode;
  __allocator_type __a2;
  __state_type local_98;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:302:68)>_>,_bool>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:302:68)>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_88;
  __allocator_type __a2_1;
  thread local_70;
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  __basic_future<bool> local_58;
  handle asyncInfo;
  
  if (this->singleThreadFederate == true) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    pcVar4 = "Async function calls and methods are not allowed for single thread federates";
    sStack_b0 = 0x4c;
LAB_001927ca:
    message._M_str = pcVar4;
    message._M_len = sStack_b0;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  cmode = (this->currentMode)._M_i;
  if ((cmode != PENDING_INIT) && (cmode != INITIALIZING)) {
    if (cmode != STARTUP) {
      this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      pcVar4 = "cannot transition from current mode to initializing mode";
      sStack_b0 = 0x38;
      goto LAB_001927ca;
    }
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (&asyncInfo,
               (this->asyncCallInfo)._M_t.
               super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               .
               super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
               ._M_head_impl);
    bVar1 = std::atomic<helics::Federate::Modes>::compare_exchange_strong
                      (&this->currentMode,&cmode,PENDING_INIT,seq_cst);
    if (bVar1) {
      local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = (pointer)operator_new(0x50);
      (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_004b4b28;
      *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var2->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x18) = 0;
      local_88._M_alloc = &__a2;
      *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20) = 0;
      *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x28) = 0;
      (p_Var2->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_004b4b78;
      local_88._M_ptr = p_Var2;
      p_Var3 = (_Result<bool> *)operator_new(0x18);
      std::__future_base::_Result<bool>::_Result(p_Var3);
      *(_Result<bool> **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x30) = p_Var3;
      *(Federate **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x38) = this;
      local_70._M_id._M_thread = (id)0;
      ___a2_1 = (long *)operator_new(0x20);
      *___a2_1 = (long)&PTR___State_004b4bd0;
      ___a2_1[1] = (long)&p_Var2->_M_impl;
      ___a2_1[2] = (long)std::__future_base::
                         _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:302:68)>_>,_bool>
                         ::_M_run;
      ___a2_1[3] = 0;
      std::thread::_M_start_thread(&local_70,&__a2_1,0);
      if (___a2_1 != (long *)0x0) {
        (**(code **)(*___a2_1 + 8))();
      }
      std::thread::operator=
                ((thread *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20),&local_70);
      std::thread::~thread(&local_70);
      local_88._M_ptr = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:302:68)>_>,_bool>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:302:68)>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_88);
      local_68 = 0;
      _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_88._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:302:68)>_>,_bool>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:302:68)>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)local_98.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
      local_88._M_ptr =
           (pointer)local_98.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var2->_M_impl;
      local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
      if (local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        p_Var2 = (pointer)operator_new(0x40);
        local_88._M_alloc =
             (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:302:68)>_>,_bool>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:302:68)>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>
              *)&__a2_1;
        (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_004b4c10;
        *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = 0;
        *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x10) = 0;
        (p_Var2->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
        *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x18) = 0;
        (p_Var2->_M_impl)._M_storage._M_storage.__align =
             (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_004b4c60;
        local_88._M_ptr = p_Var2;
        p_Var3 = (_Result<bool> *)operator_new(0x18);
        std::__future_base::_Result<bool>::_Result(p_Var3);
        *(_Result<bool> **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20) = p_Var3;
        *(Federate **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x28) = this;
        local_88._M_ptr = (pointer)0x0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:302:68)>_>,_bool>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:302:68)>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:302:68)>_>,_bool>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:302:68)>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&local_88);
        local_68 = 0;
        _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_88._M_alloc =
             (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:302:68)>_>,_bool>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:302:68)>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>
              *)local_98.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
        local_88._M_ptr =
             (pointer)local_98.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&p_Var2->_M_impl;
        local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
      }
      std::__basic_future<bool>::__basic_future(&local_58,&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_98.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::future<bool>::operator=(&(asyncInfo.data)->initFuture,(future<bool> *)&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::unique_lock<std::mutex>::~unique_lock(&asyncInfo.m_handle_lock);
  }
  return;
}

Assistant:

void Federate::enterInitializingModeAsync()
{
    if (singleThreadFederate) {
        throw(InvalidFunctionCall(
            "Async function calls and methods are not allowed for single thread federates"));
    }
    auto cmode = currentMode.load();
    if (cmode == Modes::STARTUP) {
        auto asyncInfo = asyncCallInfo->lock();
        if (currentMode.compare_exchange_strong(cmode, Modes::PENDING_INIT)) {
            asyncInfo->initFuture = std::async(std::launch::async, [this]() {
                if (hasPotentialInterfaces) {
                    potentialInterfacesStartupSequence();
                }
                return coreObject->enterInitializingMode(fedID);
            });
        }
    } else if (cmode == Modes::PENDING_INIT) {
        return;
    } else if (cmode != Modes::INITIALIZING) {
        // if we are already in initialization do nothing
        throw(InvalidFunctionCall("cannot transition from current mode to initializing mode"));
    }
}